

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O1

void If_CutPrintTiming(If_Man_t *p,If_Cut_t *pCut)

{
  float fVar1;
  void *pvVar2;
  ulong uVar3;
  
  Abc_Print(1,"{");
  if (0xffffff < *(uint *)&pCut->field_0x1c) {
    uVar3 = 0;
    do {
      fVar1 = (&pCut[1].Area)[uVar3];
      if (((long)(int)fVar1 < 0) || (p->vObjs->nSize <= (int)fVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = p->vObjs->pArray[(int)fVar1];
      if (pvVar2 == (void *)0x0) break;
      Abc_Print(1," %d(%.2f/%.2f)",(double)*(float *)((long)pvVar2 + 0x5c),
                (double)*(float *)((long)pvVar2 + 0x34),(ulong)*(uint *)((long)pvVar2 + 4));
      uVar3 = uVar3 + 1;
    } while (uVar3 < (byte)pCut->field_0x1f);
  }
  Abc_Print(1," }\n");
  return;
}

Assistant:

void If_CutPrintTiming( If_Man_t * p, If_Cut_t * pCut )
{
    If_Obj_t * pLeaf;
    unsigned i;
    Abc_Print( 1, "{" );
    If_CutForEachLeaf( p, pCut, pLeaf, i )
        Abc_Print( 1, " %d(%.2f/%.2f)", pLeaf->Id, If_ObjCutBest(pLeaf)->Delay, pLeaf->Required );
    Abc_Print( 1, " }\n" );
}